

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_mem_ExecutableBlockArena.cpp
# Opt level: O1

void * axl::mem::allocateExecutablePages(size_t size)

{
  void *pvVar1;
  
  pvVar1 = mmap((void *)0x0,size,7,0x22,-1,0);
  if (pvVar1 == (void *)0x0) {
    err::setLastSystemError();
  }
  return pvVar1;
}

Assistant:

void*
allocateExecutablePages(size_t size) {
	void* pages = ::mmap(
		NULL,
		size,
		PROT_EXEC | PROT_READ | PROT_WRITE,
		MAP_PRIVATE | MAP_ANON,
		-1,
		0
	);

	if (!pages)
		err::setLastSystemError();

	return pages;
}